

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cxx
# Opt level: O0

void __thiscall
Function::Function(Function *this,Function *left,Function *right,Function *plus,FunctionType type)

{
  Function *ctx;
  FunctionType type_local;
  Function *plus_local;
  Function *right_local;
  Function *left_local;
  Function *this_local;
  
  ctx = left;
  Physical::Physical(&this->super_Physical);
  (this->super_Physical)._vptr_Physical = (_func_int **)&PTR__Function_0018f008;
  std::vector<Function_*,_std::allocator<Function_*>_>::vector(&this->vParents);
  std::__cxx11::string::string((string *)&this->sName);
  init(this,(EVP_PKEY_CTX *)ctx);
  this->xLeft = left;
  this->xRight = right;
  this->xPlus = plus;
  this->dXMin = right->dXMin;
  this->dXMax = right->dXMax;
  this->dXStep = right->dXStep;
  this->dYMin = right->dYMin;
  this->dYMax = right->dYMax;
  this->dYStep = right->dYStep;
  setType(this,type);
  return;
}

Assistant:

Function::Function( Function& left, Function& right, Function& plus, FunctionType type )
{
	init();
	xLeft = &left;
	xRight = &right;
	xPlus = &plus;
	dXMin = right.dXMin;
	dXMax = right.dXMax;
	dXStep = right.dXStep;
	dYMin = right.dYMin;
	dYMax = right.dYMax;
	dYStep = right.dYStep;
	setType(type);
}